

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O2

tuple<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
* generate_list<trng::lcg64_count_shift>
            (tuple<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             *__return_storage_ptr__,lcg64_count_shift *r1,lcg64_count_shift *r2,long N,long skip1,
            long skip2)

{
  _Tuple_impl<0ul,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
  *p_Var1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> v2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> v1;
  result_type local_90;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  _Tuple_impl<0ul,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
  *local_48;
  long local_40;
  long local_38;
  
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < N) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,N);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88,N);
  }
  lVar2 = 0;
  local_38 = skip1;
  if (skip1 < 1) {
    local_38 = lVar2;
  }
  local_40 = skip2;
  if (skip2 < 1) {
    local_40 = lVar2;
  }
  if (N < 1) {
    N = lVar2;
  }
  local_48 = (_Tuple_impl<0ul,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
              *)__return_storage_ptr__;
  for (; p_Var1 = local_48, lVar2 != N; lVar2 = lVar2 + 1) {
    local_90 = trng::lcg64_count_shift::operator()(r1);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,&local_90);
    local_90 = trng::lcg64_count_shift::operator()(r2);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88,&local_90);
    lVar3 = local_38;
    while (bVar5 = lVar3 != 0, lVar3 = lVar3 + -1, lVar4 = local_40, bVar5) {
      trng::lcg64_count_shift::operator()(r1);
    }
    while (lVar4 != 0) {
      trng::lcg64_count_shift::operator()(r2);
      lVar4 = lVar4 + -1;
    }
  }
  std::
  _Tuple_impl<0ul,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
  ::
  _Tuple_impl<std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,void>
            (local_48,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88);
  Catch::clara::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_88);
  Catch::clara::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_68);
  return (tuple<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          *)p_Var1;
}

Assistant:

std::tuple<std::vector<typename R::result_type>, std::vector<typename R::result_type>>
generate_list(R &r1, R &r2, const long N, const long skip1, const long skip2) {
  std::vector<typename R::result_type> v1, v2;
  if (N > 0) {
    v1.reserve(N);
    v2.reserve(N);
  }
  for (long i{0}; i < N; ++i) {
    v1.push_back(r1());
    v2.push_back(r2());
    for (long j{0}; j < skip1; ++j)
      r1();
    for (long j{0}; j < skip2; ++j)
      r2();
  }
  return {v1, v2};
}